

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

SectionHeader * __thiscall
Wasm::WasmBinaryReader::ReadNextSection
          (SectionHeader *__return_storage_ptr__,WasmBinaryReader *this)

{
  SectionHeader *pSVar1;
  SectionCode SVar2;
  undefined1 uVar3;
  undefined2 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  uint32 uVar7;
  undefined4 uVar8;
  bool bVar9;
  uint sourceContextId;
  LocalFunctionId functionId;
  byte *pbVar10;
  FunctionBody *pFVar11;
  SectionHeader local_68;
  SectionHeader *local_40;
  Phases *local_38;
  
  pSVar1 = &this->m_currentSection;
  pbVar10 = this->m_pc;
  local_38 = (Phases *)&DAT_01453738;
  local_40 = __return_storage_ptr__;
  while (pbVar10 < this->m_end) {
    ReadSectionHeader(&local_68,this);
    (this->m_currentSection).name = local_68.name;
    (this->m_currentSection).end = local_68.end;
    (this->m_currentSection).nameLength = local_68.nameLength;
    *(undefined4 *)&(this->m_currentSection).field_0x1c = local_68._28_4_;
    pSVar1->code = local_68.code;
    *(undefined7 *)&pSVar1->field_0x1 = local_68._1_7_;
    (this->m_currentSection).start = local_68.start;
    if (*(int *)(SectionInfo::All + (ulong)(this->m_currentSection).code * 0x18) != 1)
    goto LAB_00d62b85;
    pFVar11 = (this->m_funcState).body;
    if (pFVar11 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
      bVar9 = Js::Phases::IsEnabled(local_38,WasmSectionPhase);
      if (bVar9) {
LAB_00d62b08:
        Output::Print(L"Ignore this section");
        Output::Print(L"\n");
        Output::Flush();
      }
    }
    else {
      sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
      if (this->m_readerState == READER_STATE_FUNCTION) {
        pFVar11 = (this->m_funcState).body;
      }
      else {
        pFVar11 = (FunctionBody *)0x0;
      }
      functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
      bVar9 = Js::Phases::IsEnabled(local_38,WasmSectionPhase,sourceContextId,functionId);
      if (bVar9) goto LAB_00d62b08;
    }
    pbVar10 = (this->m_currentSection).end;
    this->m_pc = pbVar10;
  }
  *(undefined8 *)pSVar1 = 0;
  (this->m_currentSection).start = (byte *)0x0;
  (this->m_currentSection).end = (byte *)0x0;
  *(undefined8 *)&(this->m_currentSection).nameLength = 0;
  (this->m_currentSection).name = (char16 *)0x0;
  pSVar1->code = bSectLimit;
LAB_00d62b85:
  local_40->name = (this->m_currentSection).name;
  SVar2 = pSVar1->code;
  uVar6 = *(undefined8 *)&(this->m_currentSection).field_0x1;
  uVar5 = *(undefined4 *)((long)&(this->m_currentSection).start + 1);
  uVar4 = *(undefined2 *)((long)&(this->m_currentSection).start + 5);
  uVar3 = *(undefined1 *)((long)&(this->m_currentSection).start + 7);
  uVar7 = (this->m_currentSection).nameLength;
  uVar8 = *(undefined4 *)&(this->m_currentSection).field_0x1c;
  local_40->end = (this->m_currentSection).end;
  local_40->nameLength = uVar7;
  *(undefined4 *)&local_40->field_0x1c = uVar8;
  local_40->code = SVar2;
  *(undefined8 *)&local_40->field_0x1 = uVar6;
  *(undefined4 *)((long)&local_40->start + 1) = uVar5;
  *(undefined2 *)((long)&local_40->start + 5) = uVar4;
  *(undefined1 *)((long)&local_40->start + 7) = uVar3;
  return local_40;
}

Assistant:

SectionHeader WasmBinaryReader::ReadNextSection()
{
    while (true)
    {
        if (EndOfModule())
        {
            memset(&m_currentSection, 0, sizeof(SectionHeader));
            m_currentSection.code = bSectLimit;
            return m_currentSection;
        }

        m_currentSection = ReadSectionHeader();
        if (SectionInfo::All[m_currentSection.code].flag == fSectIgnore)
        {
            TRACE_WASM_SECTION(_u("Ignore this section"));
            m_pc = m_currentSection.end;
            // Read next section
            continue;
        }

        return m_currentSection;
    }
}